

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O2

Reals Omega_h::repeat_matrix<3>(LO n,Tensor<3> m)

{
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  Int i;
  undefined4 in_register_0000003c;
  double *pdVar4;
  Int j;
  long lVar5;
  Reals RVar6;
  Reals RVar7;
  Few<double,_9> in_stack_ffffffffffffff18;
  Vector<9> v;
  double local_50 [9];
  
  RVar7.write_.shared_alloc_.alloc._4_4_ = in_register_0000003c;
  RVar7.write_.shared_alloc_.alloc._0_4_ = n;
  pdVar3 = local_50;
  pdVar2 = (double *)&m;
  pdVar4 = pdVar3;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar4 = *pdVar2;
    pdVar2 = pdVar2 + 1;
    pdVar4 = pdVar4 + 1;
  }
  pdVar2 = (double *)&v;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    pdVar4 = pdVar3;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      pdVar2[lVar5] = *pdVar4;
      pdVar4 = pdVar4 + 3;
    }
    pdVar3 = pdVar3 + 1;
    pdVar2 = pdVar2 + 3;
  }
  pdVar3 = (double *)&v;
  pdVar2 = (double *)&stack0xffffffffffffff18;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *pdVar2 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar2 = pdVar2 + 1;
  }
  RVar6 = repeat_vector<9>(n,(Vector<9>)in_stack_ffffffffffffff18.array_);
  RVar7.write_.shared_alloc_.direct_ptr = RVar6.write_.shared_alloc_.direct_ptr;
  return (Reals)RVar7.write_.shared_alloc_;
}

Assistant:

Reals repeat_matrix(LO const n, Tensor<dim> const m) {
  return repeat_vector(n, matrix2vector(m));
}